

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void constructor(LexState *ls,expdesc *t)

{
  FuncState *fs_00;
  int iVar1;
  bool bVar2;
  undefined1 local_78 [8];
  ConsControl cc;
  int pc;
  int line;
  FuncState *fs;
  expdesc *t_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  cc._76_4_ = ls->linenumber;
  cc.tostore = luaK_codeABC(fs_00,OP_NEWTABLE,0,0,0);
  cc.nh = 0;
  cc.t._0_4_ = 0;
  cc.t._4_4_ = 0;
  cc.v._48_8_ = t;
  init_exp(t,VRELOCABLE,cc.tostore,0x80,(TString *)0x0);
  t->pc = cc.tostore;
  init_exp((expdesc *)local_78,VVOID,0,0xffffffff,(TString *)0x0);
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  do {
    if ((local_78._0_4_ != VVOID) && (cc.nh < 1)) {
      __assert_fail("cc.v.k == VVOID || cc.tostore > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x4b3,"void constructor(LexState *, expdesc *)");
    }
    if ((ls->t).token == 0x7d) break;
    closelistfield(fs_00,(ConsControl *)local_78);
    field(ls,(ConsControl *)local_78);
    iVar1 = testnext(ls,0x2c);
    bVar2 = true;
    if (iVar1 == 0) {
      iVar1 = testnext(ls,0x3b);
      bVar2 = iVar1 != 0;
    }
  } while (bVar2);
  check_match(ls,0x7d,0x7b,cc._76_4_);
  lastlistfield(fs_00,(ConsControl *)local_78);
  iVar1 = luaO_int2fb(cc.t._4_4_);
  *(char *)((long)fs_00->f->code + (long)cc.tostore * 4 + 3) = (char)iVar1;
  iVar1 = luaO_int2fb((uint)cc.t);
  *(char *)((long)fs_00->f->code + (long)cc.tostore * 4 + 2) = (char)iVar1;
  if ((ravi_parser_debug & 1U) != 0) {
    raviY_printf(ls->fs,"constructor (OP_NEWTABLE pc = %d) %e\n",(ulong)(uint)cc.tostore,t);
  }
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  struct ConsControl cc;
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VRELOCABLE, pc, RAVI_TM_TABLE, NULL); /* RAVI initial type may be modified */
  t->pc = pc; /* RAVI save pc of OP_NEWTABLE instruction so that the correct type can be set later */
  init_exp(&cc.v, VVOID, 0, RAVI_TM_ANY, NULL);  /* no value (yet) */
  luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
  SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
  DEBUG_EXPR(raviY_printf(ls->fs, "constructor (OP_NEWTABLE pc = %d) %e\n", pc, t);)
}